

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)

{
  opj_tile_index_t *poVar1;
  void *pvVar2;
  opj_codestream_index_t *poVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
  p_j2k->cstr_index->nb_of_tiles = uVar4;
  poVar1 = (opj_tile_index_t *)opj_calloc((ulong)uVar4,0x38);
  poVar3 = p_j2k->cstr_index;
  poVar3->tile_index = poVar1;
  if (poVar1 != (opj_tile_index_t *)0x0) {
    uVar5 = 0xffffffffffffffff;
    lVar6 = 0;
    do {
      uVar5 = uVar5 + 1;
      if (poVar3->nb_of_tiles <= uVar5) {
        return 1;
      }
      *(undefined4 *)((long)&poVar1->maxmarknum + lVar6) = 100;
      *(undefined4 *)((long)&poVar1->marknum + lVar6) = 0;
      pvVar2 = opj_calloc(100,0x18);
      poVar3 = p_j2k->cstr_index;
      poVar1 = poVar3->tile_index;
      *(void **)((long)&poVar1->marker + lVar6) = pvVar2;
      lVar6 = lVar6 + 0x38;
    } while (pvVar2 != (void *)0x0);
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 it_tile = 0;

    p_j2k->cstr_index->nb_of_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
    p_j2k->cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(
                                        p_j2k->cstr_index->nb_of_tiles, sizeof(opj_tile_index_t));
    if (!p_j2k->cstr_index->tile_index) {
        return OPJ_FALSE;
    }

    for (it_tile = 0; it_tile < p_j2k->cstr_index->nb_of_tiles; it_tile++) {
        p_j2k->cstr_index->tile_index[it_tile].maxmarknum = 100;
        p_j2k->cstr_index->tile_index[it_tile].marknum = 0;
        p_j2k->cstr_index->tile_index[it_tile].marker = (opj_marker_info_t*)
                opj_calloc(p_j2k->cstr_index->tile_index[it_tile].maxmarknum,
                           sizeof(opj_marker_info_t));
        if (!p_j2k->cstr_index->tile_index[it_tile].marker) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}